

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O3

bool __thiscall lr_grammar::GrammarLR::sim(GrammarLR *this,char *testString)

{
  pointer pvVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  _Elt_pointer psVar7;
  long *plVar8;
  int *piVar9;
  undefined8 *puVar10;
  size_type *psVar11;
  pointer pEVar12;
  Express *this_00;
  stackElem *psVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  stackElem e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string text;
  vector<stackElem,_std::allocator<stackElem>_> elemprint;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ipString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_5;
  string tmp;
  stack<stackElem,_std::deque<stackElem,_std::allocator<stackElem>_>_> s;
  string bufS;
  stringstream sstream;
  char buffer [200];
  stackElem local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  long local_4c0;
  stackElem *local_4b8;
  iterator iStack_4b0;
  stackElem *local_4a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_498;
  long local_478;
  int local_46c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  long local_428;
  ulong local_420;
  _Deque_base<stackElem,_std::allocator<stackElem>_> local_418;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  undefined1 *local_2c0;
  undefined8 local_2b8;
  undefined1 local_2b0 [16];
  string local_2a0;
  long local_280 [2];
  ostream local_270 [16];
  int aiStack_260 [24];
  ios_base local_200 [104];
  long alStack_198 [20];
  char local_f8 [200];
  
  local_498.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_498.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_498.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_2a0,testString,(allocator *)local_280);
  public_tool::parse_elem(&local_2a0,&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  local_418._M_impl.super__Deque_impl_data._M_finish._M_last = (stackElem *)0x0;
  local_418._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_418._M_impl.super__Deque_impl_data._M_finish._M_cur = (stackElem *)0x0;
  local_418._M_impl.super__Deque_impl_data._M_finish._M_first = (stackElem *)0x0;
  local_418._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_418._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_418._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_418._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_418._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_418._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<stackElem,_std::allocator<stackElem>_>::_M_initialize_map(&local_418,0);
  local_4b8 = (stackElem *)0x0;
  iStack_4b0._M_current = (stackElem *)0x0;
  local_4a8 = (stackElem *)0x0;
  local_2c0 = local_2b0;
  local_2b8 = 0;
  local_2b0[0] = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)local_280);
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  local_448._M_string_length = 0;
  local_448.field_2._M_local_buf[0] = '\0';
  local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
  local_4e0._M_string_length = 0;
  local_4e0.field_2._M_local_buf[0] = '\0';
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"#","");
  local_508.elemKey = find_name(this,&local_2e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  local_508 = (stackElem)((ulong)(uint)local_508.elemKey << 0x20);
  if (local_418._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_418._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<stackElem,std::allocator<stackElem>>::_M_push_back_aux<stackElem_const&>
              ((deque<stackElem,std::allocator<stackElem>> *)&local_418,&local_508);
  }
  else {
    *local_418._M_impl.super__Deque_impl_data._M_finish._M_cur = local_508;
    local_418._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_418._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (iStack_4b0._M_current == local_4a8) {
    std::vector<stackElem,std::allocator<stackElem>>::_M_realloc_insert<stackElem_const&>
              ((vector<stackElem,std::allocator<stackElem>> *)&local_4b8,iStack_4b0,&local_508);
  }
  else {
    *iStack_4b0._M_current = local_508;
    iStack_4b0._M_current = iStack_4b0._M_current + 1;
  }
  local_428 = 0;
  uVar5 = 0;
  do {
    local_420 = (ulong)uVar5;
    local_4c0 = local_420 << 5;
    do {
      while( true ) {
        paVar14 = &local_500.field_2;
        lVar6 = (long)local_508.states;
        pvVar1 = (this->action_table).
                 super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
        lVar16 = *(long *)((long)&((local_498.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          local_4c0);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_320,lVar16,
                   *(long *)((long)&(local_498.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                            local_4c0) + lVar16);
        iVar3 = find_name(this,&local_320);
        bVar17 = true;
        if (*(int *)(*(long *)&pvVar1[lVar6].
                               super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                               ._M_impl.super__Vector_impl_data + (long)iVar3 * 0xc) != 1) {
          lVar6 = (long)local_508.states;
          pvVar1 = (this->action_table).
                   super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
          lVar16 = *(long *)((long)&((local_498.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + local_4c0);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_340,lVar16,
                     *(long *)((long)&(local_498.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length
                              + local_4c0) + lVar16);
          iVar3 = find_name(this,&local_340);
          bVar17 = *(int *)(*(long *)&pvVar1[lVar6].
                                      super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                                      ._M_impl.super__Vector_impl_data + (long)iVar3 * 0xc) == 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != &local_340.field_2) {
            operator_delete(local_340._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p);
        }
        if (!bVar17) {
          lVar6 = (long)local_508.states;
          pvVar1 = (this->action_table).
                   super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar16 = *(long *)((long)&((local_498.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + local_4c0);
          local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_300,lVar16,
                     *(long *)((long)&(local_498.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length
                              + local_4c0) + lVar16);
          iVar3 = find_name(this,&local_300);
          iVar3 = *(int *)(*(long *)&pvVar1[lVar6].
                                     super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                                     ._M_impl.super__Vector_impl_data + (long)iVar3 * 0xc);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_300._M_dataplus._M_p != &local_300.field_2) {
            operator_delete(local_300._M_dataplus._M_p);
          }
          if (iVar3 == 2) {
            local_500._M_dataplus._M_p = (pointer)paVar14;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_500,local_4e0._M_dataplus._M_p,
                       local_4e0._M_dataplus._M_p + local_4e0._M_string_length);
            std::__cxx11::string::append((char *)&local_500);
          }
          else {
            local_500._M_dataplus._M_p = (pointer)paVar14;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_500,local_4e0._M_dataplus._M_p,
                       local_4e0._M_dataplus._M_p + local_4e0._M_string_length);
            std::__cxx11::string::append((char *)&local_500);
          }
          std::__cxx11::string::operator=((string *)&local_4e0,(string *)&local_500);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != paVar14) {
            operator_delete(local_500._M_dataplus._M_p);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,local_4e0._M_dataplus._M_p,local_4e0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
            operator_delete(local_4e0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_448._M_dataplus._M_p != &local_448.field_2) {
            operator_delete(local_448._M_dataplus._M_p);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_280);
          std::ios_base::~ios_base(local_200);
          if (local_2c0 != local_2b0) {
            operator_delete(local_2c0);
          }
          if (local_4b8 != (stackElem *)0x0) {
            operator_delete(local_4b8);
          }
          std::_Deque_base<stackElem,_std::allocator<stackElem>_>::~_Deque_base(&local_418);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_498);
          return iVar3 != 2;
        }
        psVar7 = local_418._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_418._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_418._M_impl.super__Deque_impl_data._M_finish._M_first) {
          psVar7 = local_418._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        local_508 = psVar7[-1];
        std::__cxx11::string::_M_replace
                  ((ulong)&local_448,0,(char *)local_448._M_string_length,0x1110d4);
        if (iStack_4b0._M_current != local_4b8) {
          uVar15 = 0;
          do {
            std::operator+(&local_500,&local_448,
                           &(this->elements).
                            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                            ._M_impl.super__Vector_impl_data._M_start[local_4b8[uVar15].elemKey].
                            super_Elem.name);
            std::__cxx11::string::operator=((string *)&local_448,(string *)&local_500);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_500._M_dataplus._M_p != paVar14) {
              operator_delete(local_500._M_dataplus._M_p);
            }
            std::ios::clear((int)*(undefined8 *)(local_280[0] + -0x18) + (int)local_280);
            std::ostream::operator<<(local_270,local_4b8[uVar15].states);
            lVar16 = *(long *)(local_270 + *(long *)(local_280[0] + -0x18));
            std::__istream_extract((istream *)local_280,local_f8,200);
            if ((((*(int *)((long)aiStack_260 + *(long *)(local_280[0] + -0x18)) == 0) &&
                 (lVar16 - 0xc9U < 0xffffffffffffff38)) &&
                (plVar8 = *(long **)((long)alStack_198 + *(long *)(local_280[0] + -0x18)),
                (ulong)plVar8[3] <= (ulong)plVar8[2])) &&
               (iVar3 = (**(code **)(*plVar8 + 0x48))(), iVar3 == -1)) {
              std::ios::clear((int)&local_508 + (int)*(undefined8 *)(local_280[0] + -0x18) + 0x288);
            }
            local_500._M_dataplus._M_p = (pointer)paVar14;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_500,local_448._M_dataplus._M_p,
                       (char *)(local_448._M_string_length + (long)local_448._M_dataplus._M_p));
            std::__cxx11::string::append((char *)&local_500);
            std::__cxx11::string::operator=((string *)&local_448,(string *)&local_500);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_500._M_dataplus._M_p != paVar14) {
              operator_delete(local_500._M_dataplus._M_p);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 < (ulong)((long)iStack_4b0._M_current - (long)local_4b8 >> 3));
        }
        sprintf(local_f8,"%-25s",local_448._M_dataplus._M_p);
        local_500._M_dataplus._M_p = (pointer)paVar14;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_500,local_4e0._M_dataplus._M_p,
                   local_4e0._M_dataplus._M_p + local_4e0._M_string_length);
        std::__cxx11::string::append((char *)&local_500);
        std::__cxx11::string::operator=((string *)&local_4e0,(string *)&local_500);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != paVar14) {
          operator_delete(local_500._M_dataplus._M_p);
        }
        std::__cxx11::string::_M_replace
                  ((ulong)&local_448,0,(char *)local_448._M_string_length,0x1110d4);
        lVar16 = local_428;
        uVar15 = local_420;
        if (local_420 <
            (ulong)((long)local_498.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_498.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          do {
            std::operator+(&local_500,&local_448,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&((local_498.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar16));
            std::__cxx11::string::operator=((string *)&local_448,(string *)&local_500);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_500._M_dataplus._M_p != paVar14) {
              operator_delete(local_500._M_dataplus._M_p);
            }
            uVar15 = uVar15 + 1;
            lVar16 = lVar16 + 0x20;
          } while (uVar15 < (ulong)((long)local_498.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_498.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        sprintf(local_f8,"%+15s         ",local_448._M_dataplus._M_p);
        local_500._M_dataplus._M_p = (pointer)paVar14;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_500,local_4e0._M_dataplus._M_p,
                   local_4e0._M_dataplus._M_p + local_4e0._M_string_length);
        std::__cxx11::string::append((char *)&local_500);
        std::__cxx11::string::operator=((string *)&local_4e0,(string *)&local_500);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != paVar14) {
          operator_delete(local_500._M_dataplus._M_p);
        }
        lVar6 = (long)local_508.states;
        pvVar1 = (this->action_table).
                 super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
        lVar16 = *(long *)((long)&((local_498.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          local_4c0);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_360,lVar16,
                   *(long *)((long)&(local_498.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                            local_4c0) + lVar16);
        iVar3 = find_name(this,&local_360);
        iVar3 = *(int *)(*(long *)&pvVar1[lVar6].
                                   super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                                   ._M_impl.super__Vector_impl_data + (long)iVar3 * 0xc);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p);
        }
        if (iVar3 != 1) break;
        local_500._M_dataplus._M_p = (pointer)paVar14;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_500,local_4e0._M_dataplus._M_p,
                   local_4e0._M_dataplus._M_p + local_4e0._M_string_length);
        std::__cxx11::string::append((char *)&local_500);
        std::__cxx11::string::operator=((string *)&local_4e0,(string *)&local_500);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != paVar14) {
          operator_delete(local_500._M_dataplus._M_p);
        }
        lVar6 = (long)local_508.states;
        pvVar1 = (this->action_table).
                 super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
        lVar16 = *(long *)((long)&((local_498.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          local_4c0);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_380,lVar16,
                   *(long *)((long)&(local_498.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                            local_4c0) + lVar16);
        iVar4 = find_name(this,&local_380);
        lVar16 = *(long *)&pvVar1[lVar6].
                           super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                           ._M_impl.super__Vector_impl_data;
        iVar3 = *(int *)(lVar16 + 4 + (long)iVar4 * 0xc);
        lVar16 = (long)*(int *)(lVar16 + 8 + (long)iVar4 * 0xc);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          operator_delete(local_380._M_dataplus._M_p);
        }
        lVar6 = (long)iVar3;
        local_478 = lVar6;
        local_46c = iVar3;
        std::operator+(&local_468,&local_4e0,
                       &(this->elements).
                        super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar6].super_Elem.name);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_468);
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_500.field_2._M_allocated_capacity = *psVar11;
          local_500.field_2._8_8_ = plVar8[3];
          local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
        }
        else {
          local_500.field_2._M_allocated_capacity = *psVar11;
          local_500._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_500._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_4e0,(string *)&local_500);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != &local_500.field_2) {
          operator_delete(local_500._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_dataplus._M_p != &local_468.field_2) {
          operator_delete(local_468._M_dataplus._M_p);
        }
        lVar2 = *(long *)&(this->elements).
                          super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar6].expression_of_set.
                          super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                          ._M_impl.super__Vector_impl_data;
        if (*(long *)(lVar2 + 8 + lVar16 * 0x18) != *(long *)(lVar2 + lVar16 * 0x18)) {
          this_00 = (Express *)(lVar2 + lVar16 * 0x18);
          uVar15 = 0;
          do {
            piVar9 = base_grammar::Express::operator[](this_00,(int)uVar15);
            if (*piVar9 != -1) {
              piVar9 = base_grammar::Express::operator[]
                                 ((Express *)
                                  (lVar16 * 0x18 +
                                  *(long *)&(this->elements).
                                            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                            expression_of_set.
                                            super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                            ._M_impl.super__Vector_impl_data),(int)uVar15);
              std::operator+(&local_500,&local_4e0,
                             &(this->elements).
                              super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                              ._M_impl.super__Vector_impl_data._M_start[*piVar9].super_Elem.name);
              std::__cxx11::string::operator=((string *)&local_4e0,(string *)&local_500);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_500._M_dataplus._M_p != &local_500.field_2) {
                operator_delete(local_500._M_dataplus._M_p);
              }
            }
            uVar15 = uVar15 + 1;
            this_00 = (Express *)
                      (*(long *)&(this->elements).
                                 super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar6].expression_of_set.
                                 super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                 ._M_impl.super__Vector_impl_data + lVar16 * 0x18);
          } while (uVar15 < (ulong)((long)(this_00->expression).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish -
                                    (long)(this_00->expression).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start >> 2));
        }
        local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_500,local_4e0._M_dataplus._M_p,
                   local_4e0._M_dataplus._M_p + local_4e0._M_string_length);
        std::__cxx11::string::append((char *)&local_500);
        std::__cxx11::string::operator=((string *)&local_4e0,(string *)&local_500);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != &local_500.field_2) {
          operator_delete(local_500._M_dataplus._M_p);
        }
        pEVar12 = (this->elements).
                  super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar2 = *(long *)&pEVar12[lVar6].expression_of_set.
                          super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                          ._M_impl.super__Vector_impl_data;
        psVar13 = local_418._M_impl.super__Deque_impl_data._M_finish._M_first;
        if (*(long *)(lVar2 + 8 + lVar16 * 0x18) != *(long *)(lVar2 + lVar16 * 0x18)) {
          uVar15 = 0;
          do {
            if (local_418._M_impl.super__Deque_impl_data._M_finish._M_cur == psVar13) {
              operator_delete(psVar13);
              psVar13 = local_418._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_418._M_impl.super__Deque_impl_data._M_finish._M_last = psVar13 + 0x40;
              local_418._M_impl.super__Deque_impl_data._M_finish._M_cur = psVar13 + 0x3f;
              pEVar12 = (this->elements).
                        super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_418._M_impl.super__Deque_impl_data._M_finish._M_first = psVar13;
              local_418._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_418._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              local_418._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_418._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            iStack_4b0._M_current = iStack_4b0._M_current + -1;
            uVar15 = uVar15 + 1;
            lVar2 = *(long *)&pEVar12[lVar6].expression_of_set.
                              super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                              ._M_impl.super__Vector_impl_data;
          } while (uVar15 < (ulong)(*(long *)(lVar2 + 8 + lVar16 * 0x18) -
                                    *(long *)(lVar2 + lVar16 * 0x18) >> 2));
        }
        psVar7 = local_418._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_418._M_impl.super__Deque_impl_data._M_finish._M_cur == psVar13) {
          psVar7 = local_418._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        local_508 = psVar7[-1];
        lVar16 = *(long *)&(this->action_table).
                           super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_508.states].
                           super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                           ._M_impl.super__Vector_impl_data;
        if (*(int *)(lVar16 + local_478 * 0xc) == 2) {
          local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_500,local_4e0._M_dataplus._M_p,
                     local_4e0._M_dataplus._M_p + local_4e0._M_string_length);
          std::__cxx11::string::append((char *)&local_500);
          std::__cxx11::string::operator=((string *)&local_4e0,(string *)&local_500);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p);
          }
        }
        else {
          local_508.elemKey = local_46c;
          local_508.states = *(int *)(lVar16 + local_478 * 0xc + 4);
          if (local_418._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_418._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<stackElem,std::allocator<stackElem>>::_M_push_back_aux<stackElem_const&>
                      ((deque<stackElem,std::allocator<stackElem>> *)&local_418,&local_508);
          }
          else {
            *local_418._M_impl.super__Deque_impl_data._M_finish._M_cur = local_508;
            local_418._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_418._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
          if (iStack_4b0._M_current == local_4a8) {
            std::vector<stackElem,std::allocator<stackElem>>::_M_realloc_insert<stackElem_const&>
                      ((vector<stackElem,std::allocator<stackElem>> *)&local_4b8,iStack_4b0,
                       &local_508);
          }
          else {
            *iStack_4b0._M_current = local_508;
            iStack_4b0._M_current = iStack_4b0._M_current + 1;
          }
        }
      }
    } while (iVar3 != 0);
    local_500._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_500,local_4e0._M_dataplus._M_p,
               local_4e0._M_dataplus._M_p + local_4e0._M_string_length);
    std::__cxx11::string::append((char *)&local_500);
    std::__cxx11::string::operator=((string *)&local_4e0,(string *)&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != paVar14) {
      operator_delete(local_500._M_dataplus._M_p);
    }
    lVar6 = (long)local_508.states;
    pvVar1 = (this->action_table).
             super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    lVar16 = *(long *)((long)&((local_498.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      local_4c0);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a0,lVar16,
               *(long *)((long)&(local_498.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                        local_4c0) + lVar16);
    iVar3 = find_name(this,&local_3a0);
    local_478 = CONCAT44(local_478._4_4_,
                         *(undefined4 *)
                          (*(long *)&pvVar1[lVar6].
                                     super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                                     ._M_impl.super__Vector_impl_data + 4 + (long)iVar3 * 0xc));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p);
    }
    std::ios::clear((int)*(undefined8 *)(local_280[0] + -0x18) + (int)local_280);
    std::ostream::operator<<(local_270,(int)local_478);
    lVar16 = *(long *)(local_270 + *(long *)(local_280[0] + -0x18));
    std::__istream_extract((istream *)local_280,local_f8,200);
    if (((*(int *)((long)aiStack_260 + *(long *)(local_280[0] + -0x18)) == 0) &&
        (lVar16 - 0xc9U < 0xffffffffffffff38)) &&
       ((plVar8 = *(long **)((long)alStack_198 + *(long *)(local_280[0] + -0x18)),
        (ulong)plVar8[3] <= (ulong)plVar8[2] &&
        (iVar3 = (**(code **)(*plVar8 + 0x48))(), iVar3 == -1)))) {
      std::ios::clear((int)&local_508 + (int)*(undefined8 *)(local_280[0] + -0x18) + 0x288);
    }
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_468,local_4e0._M_dataplus._M_p,
               local_4e0._M_dataplus._M_p + local_4e0._M_string_length);
    std::__cxx11::string::append((char *)&local_468);
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_468);
    psVar11 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_500.field_2._M_allocated_capacity = *psVar11;
      local_500.field_2._8_8_ = puVar10[3];
      local_500._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_500.field_2._M_allocated_capacity = *psVar11;
      local_500._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_500._M_string_length = puVar10[1];
    *puVar10 = psVar11;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_4e0,(string *)&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != paVar14) {
      operator_delete(local_500._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p);
    }
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    lVar16 = *(long *)((long)&((local_498.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      local_4c0);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3c0,lVar16,
               *(long *)((long)&(local_498.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                        local_4c0) + lVar16);
    iVar3 = find_name(this,&local_3c0);
    local_508.elemKey = iVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p);
    }
    local_508.states = (int)local_478;
    if (local_418._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_418._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<stackElem,std::allocator<stackElem>>::_M_push_back_aux<stackElem_const&>
                ((deque<stackElem,std::allocator<stackElem>> *)&local_418,&local_508);
    }
    else {
      *local_418._M_impl.super__Deque_impl_data._M_finish._M_cur = local_508;
      local_418._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_418._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    if (iStack_4b0._M_current == local_4a8) {
      std::vector<stackElem,std::allocator<stackElem>>::_M_realloc_insert<stackElem_const&>
                ((vector<stackElem,std::allocator<stackElem>> *)&local_4b8,iStack_4b0,&local_508);
    }
    else {
      *iStack_4b0._M_current = local_508;
      iStack_4b0._M_current = iStack_4b0._M_current + 1;
    }
    uVar5 = (int)local_420 + 1;
    local_428 = local_428 + 0x20;
  } while( true );
}

Assistant:

bool  GrammarLR::sim(char* testString){

    bool result = true;
    //不使用testString，出现双字符串无法解释;
    vector<string> ipString;
    public_tool::parse_elem(testString, ipString);

    stack<stackElem> s;//指导栈
    vector<stackElem> elemprint;//输出作用
    char formatS[] = "%-25s";//栈的格式
    char formatC[] = "%+15s         ";//字母格式的格式
    string bufS;
    char buffer[200];		//格式化的辅助
    stringstream sstream;
    string tmp;				//字符串中间
    string text;			//输出的串
    int ipIndex = 0;//ip的指向

    stackElem e;
    e.elemKey = find_name("#");//#是开始字符
    e.states = 0;//0是初态
    s.push(e);
    elemprint.push_back(e);
    ReduceByExpress r;
    int st;
    while (action_table[e.states][find_name(ipString[ipIndex])].type == REDUCE || action_table[e.states][find_name(
            ipString[ipIndex])].type == SMOVE){
        e = s.top();

        //1.输出栈
        tmp = "";
        for (int i = 0; i < elemprint.size(); i++){
            tmp = tmp + elements[elemprint[i].elemKey].name;
            sstream.clear();
            sstream << elemprint[i].states;
            sstream >> buffer;
            tmp = tmp + buffer;
        }
        sprintf(buffer, formatS, tmp.c_str());
        text = text + buffer;
        //2.当前输入
        tmp = "";
        for (int i = ipIndex; i < ipString.size(); i++){
            tmp = tmp + ipString[i];
        }
        sprintf(buffer, formatC, tmp.c_str());
        text = text + buffer;

        switch (action_table[e.states][find_name(ipString[ipIndex])].type)
        {
            //不会出现
            case ERROR: break;

            case REDUCE:
                //归约操作
                //3.进行的动作
                text = text + "REDUCE:";
                //get表达式
                r = action_table[e.states][find_name(ipString[ipIndex])].choose.R;
                text = text + elements[r.elemIndex].name + "->";
                for (int i = 0; i < elements[r.elemIndex].expression_of_set[r.expressIndex].expression.size(); i++){
                    if (elements[r.elemIndex].expression_of_set[r.expressIndex][i] == -1){ continue; }
                    text = text + elements[elements[r.elemIndex].expression_of_set[r.expressIndex][i]].name;
                }
                text = text + "\n";

                //出栈
                for (int i = 0; i < elements[r.elemIndex].expression_of_set[r.expressIndex].expression.size(); i++){
                    s.pop();
                    elemprint.pop_back();
                }
                //替换终结符操作
                e = s.top();
                if (action_table[e.states][r.elemIndex].type == ERROR){
                    text = text + "ERROR";
                    break;//跳出swtich
                }
                e.elemKey = r.elemIndex;
                e.states = action_table[e.states][r.elemIndex].choose.state;
                s.push(e);
                elemprint.push_back(e);
                break;
            case SMOVE:
                //3.进行的动作
                text = text + "SMOVE:";
                //get表达式
                st = action_table[e.states][find_name(ipString[ipIndex])].choose.state;
                sstream.clear();
                sstream << st;
                sstream >> buffer;
                text = text + buffer + "\n";

                //入栈就行
                e.elemKey = find_name(ipString[ipIndex]);
                e.states = st;
                s.push(e);
                elemprint.push_back(e);
                ipIndex++;
                break;
                //不会出现
            case ACC: break;
            default:
                break;
        }
    }


    if (action_table[e.states][find_name(ipString[ipIndex])].type == ERROR) {
        result = false;
        text = text + "ERROR\n";
    }
    else
    {
        text = text + "ACC\n";
    }
    cout << text;
    return result;
}